

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

StringPtr * __thiscall
kj::Table<unsigned_int,_kj::InsertionOrderIndex>::insert
          (Table<unsigned_int,_kj::InsertionOrderIndex> *this,StringPtr *row)

{
  StringPtr *pSVar1;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,(Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)this,*(long *)(this + 8) - *(long *)this >> 2,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pSVar1 = Vector<unsigned_int>::add<unsigned_int>((Vector<unsigned_int> *)this,row);
    return pSVar1;
  }
  _::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}